

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O2

void mi_page_extend_free(mi_heap_t *heap,mi_page_t *page,mi_tld_t *tld)

{
  short *psVar1;
  ushort uVar2;
  ushort uVar3;
  ulong bsize;
  mi_stats_t *pmVar4;
  mi_stats_t *stats;
  mi_stats_t *extend;
  
  if (heap->thread_id != 0) {
    return;
  }
  uVar2 = *(ushort *)((long)&heap->thread_delayed_free + 2);
  uVar3 = *(ushort *)((long)&heap->thread_delayed_free + 4);
  if (uVar2 < uVar3) {
    bsize = heap->keys[0];
    stats = (mi_stats_t *)((ulong)uVar3 - (ulong)uVar2);
    pmVar4 = (mi_stats_t *)0x4;
    if (bsize < 0x1000) {
      pmVar4 = (mi_stats_t *)(ulong)(ushort)(0x1000 / (ushort)bsize);
    }
    extend = (mi_stats_t *)0x4;
    if ((mi_stats_t *)0x4 < pmVar4) {
      extend = pmVar4;
    }
    if (stats < extend) {
      extend = stats;
    }
    mi_page_free_list_extend((mi_page_t *)heap,bsize,(size_t)extend,stats);
    psVar1 = (short *)((long)&heap->thread_delayed_free + 2);
    *psVar1 = *psVar1 + (short)extend;
  }
  return;
}

Assistant:

static void mi_page_extend_free(mi_heap_t* heap, mi_page_t* page, mi_tld_t* tld) {
  MI_UNUSED(tld);
  mi_assert_expensive(mi_page_is_valid_init(page));
  #if (MI_SECURE<=2)
  mi_assert(page->free == NULL);
  mi_assert(page->local_free == NULL);
  if (page->free != NULL) return;
  #endif
  if (page->capacity >= page->reserved) return;

  mi_stat_counter_increase(tld->stats.pages_extended, 1);

  // calculate the extend count
  const size_t bsize = mi_page_block_size(page);
  size_t extend = page->reserved - page->capacity;
  mi_assert_internal(extend > 0);

  size_t max_extend = (bsize >= MI_MAX_EXTEND_SIZE ? MI_MIN_EXTEND : MI_MAX_EXTEND_SIZE/bsize);
  if (max_extend < MI_MIN_EXTEND) { max_extend = MI_MIN_EXTEND; }
  mi_assert_internal(max_extend > 0);

  if (extend > max_extend) {
    // ensure we don't touch memory beyond the page to reduce page commit.
    // the `lean` benchmark tests this. Going from 1 to 8 increases rss by 50%.
    extend = max_extend;
  }

  mi_assert_internal(extend > 0 && extend + page->capacity <= page->reserved);
  mi_assert_internal(extend < (1UL<<16));

  // and append the extend the free list
  if (extend < MI_MIN_SLICES || MI_SECURE==0) { //!mi_option_is_enabled(mi_option_secure)) {
    mi_page_free_list_extend(page, bsize, extend, &tld->stats );
  }
  else {
    mi_page_free_list_extend_secure(heap, page, bsize, extend, &tld->stats);
  }
  // enable the new free list
  page->capacity += (uint16_t)extend;
  mi_stat_increase(tld->stats.page_committed, extend * bsize);
  mi_assert_expensive(mi_page_is_valid_init(page));
}